

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall
cfgfile::exception_t<cfgfile::wstring_trait_t>::~exception_t
          (exception_t<cfgfile::wstring_trait_t> *this)

{
  std::__cxx11::wstring::~wstring((wstring *)&this->m_what);
  std::logic_error::~logic_error(&this->super_logic_error);
  return;
}

Assistant:

~exception_t() noexcept
	{
	}